

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

Counts * __thiscall
wasm::InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>::
operator[](InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
           *this,Function **k)

{
  pointer ppVar1;
  pair<std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>,_bool>
  pVar2;
  _List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>
  local_e8;
  undefined1 local_e0;
  InsertOrderedMap<wasm::HeapType,_unsigned_long> local_c8;
  undefined1 local_70 [8];
  pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts> kv;
  Function **k_local;
  DefaultMap<Function_*,_std::unordered_set<wasm::HeapType>_> *this_local;
  
  local_c8.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_c8.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0;
  local_c8.Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c8.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_c8.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_c8.Map._M_h._M_rehash_policy._4_4_ = 0;
  local_c8.Map._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8.Map._M_h._M_element_count = 0;
  local_c8.Map._M_h._M_buckets = (__buckets_ptr)0x0;
  local_c8.Map._M_h._M_bucket_count = 0;
  kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = (size_t)k;
  InsertOrderedMap<wasm::HeapType,_unsigned_long>::InsertOrderedMap(&local_c8);
  std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>::
  pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts,_true>
            ((pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *)
             local_70,k,(Counts *)&local_c8);
  wasm::ModuleUtils::anon_unknown_1::Counts::~Counts((Counts *)&local_c8);
  pVar2 = insert(this,(pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                       *)local_70);
  local_e8 = pVar2.first._M_node;
  local_e0 = pVar2.second;
  ppVar1 = std::
           _List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>
           ::operator->(&local_e8);
  std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>::~pair
            ((pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *)
             local_70);
  return &ppVar1->second;
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }